

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.h
# Opt level: O0

void __thiscall
KDIS::UTILS::Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::inPlanceTranspose
          (Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *this)

{
  float fVar1;
  ushort local_14;
  ushort local_12;
  float aux;
  KUINT16 j;
  KUINT16 i;
  Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *this_local;
  
  for (local_12 = 0; local_12 < 3; local_12 = local_12 + 1) {
    for (local_14 = 0; local_14 < local_12; local_14 = local_14 + 1) {
      fVar1 = this->Data[local_12][local_14];
      this->Data[local_12][local_14] = this->Data[local_14][local_12];
      this->Data[local_14][local_12] = fVar1;
    }
  }
  return;
}

Assistant:

void inPlanceTranspose()
    {
        if( cols != rows )return;

        for( KUINT16 i = 0; i < rows; ++i )
        {
            for( KUINT16 j = 0; j < i; ++j )
            {
                Type aux = Data[i][j];
                Data[i][j] = Data[j][i];
                Data[j][i] = aux;
            }
        }
    }